

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::soo_slot(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this)

{
  size_t sVar1;
  
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 == 1) {
    return (slot_type *)
           &(this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_;
  }
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                 );
  }
  __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x101f,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::soo_slot() [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
               );
}

Assistant:

slot_type* soo_slot() {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return static_cast<slot_type*>(common().soo_data());
  }